

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

bool __thiscall
adios2::core::engine::BP4Reader::SleepOrQuit
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds)

{
  double dVar1;
  ulong uVar2;
  TimePoint TVar3;
  double dVar4;
  double dVar5;
  duration<double,_std::ratio<1L,_1L>_> local_18;
  
  TVar3 = Now();
  dVar4 = pollSeconds->__r * 1000000000.0;
  dVar5 = (double)TVar3.__d.__r + dVar4;
  dVar1 = (timeoutInstant->__d).__r;
  if (dVar5 < dVar1) {
    uVar2 = -(ulong)(dVar1 - (double)TVar3.__d.__r < dVar4);
    local_18.__r = (rep_conflict)
                   (~uVar2 & (ulong)pollSeconds->__r |
                   (ulong)((dVar1 - (double)TVar3.__d.__r) / 1000000000.0) & uVar2);
    std::this_thread::sleep_for<double,std::ratio<1l,1l>>(&local_18);
  }
  return dVar5 < dVar1;
}

Assistant:

bool BP4Reader::SleepOrQuit(const TimePoint &timeoutInstant, const Seconds &pollSeconds)
{
    auto now = Now();
    if (now + pollSeconds >= timeoutInstant)
    {
        return false;
    }
    auto remainderTime = timeoutInstant - now;
    auto sleepTime = pollSeconds;
    if (remainderTime < sleepTime)
    {
        sleepTime = remainderTime;
    }
    std::this_thread::sleep_for(sleepTime);
    return true;
}